

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

size_t __thiscall czh::file::StreamFile::get_lineno(StreamFile *this,size_t pos)

{
  bool bVar1;
  pointer pbVar2;
  type pbVar3;
  istream *piVar4;
  size_type sVar5;
  fpos<__mbstate_t> local_68 [2];
  undefined1 local_48 [8];
  string tmp;
  size_t postmp;
  size_t lineno;
  size_t pos_local;
  StreamFile *this_local;
  
  postmp = 1;
  tmp.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_48);
  pbVar2 = std::
           unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           ::operator->(&this->file);
  std::ios::clear(pbVar2 + *(long *)(*(long *)pbVar2 + -0x18),0);
  pbVar2 = std::
           unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           ::operator->(&this->file);
  std::fpos<__mbstate_t>::fpos(local_68,0);
  std::istream::seekg(pbVar2,local_68[0]._M_off,local_68[0]._M_state);
  while( true ) {
    pbVar3 = std::
             unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             ::operator*(&this->file);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)pbVar3,(string *)local_48);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar1) break;
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
    tmp.field_2._8_8_ = sVar5 + 1 + tmp.field_2._8_8_;
    if (pos <= (ulong)tmp.field_2._8_8_) break;
    postmp = postmp + 1;
  }
  std::__cxx11::string::~string((string *)local_48);
  return postmp;
}

Assistant:

[[nodiscard]] std::size_t get_lineno(std::size_t pos) const override
    {
      std::size_t lineno = 1;
      std::size_t postmp = 0;
      std::string tmp;
      file->clear();
      file->seekg(std::ios::beg);
      for (; std::getline(*file, tmp); lineno++)
      {
        postmp += tmp.size() + 1;
        if (postmp >= pos) break;
      }
      return lineno;
    }